

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

char * get_quoted_string(char **string,size_t *output_string_len)

{
  size_t __n;
  char cVar1;
  bool bVar2;
  byte bVar3;
  JSON_Status JVar4;
  byte *__src;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  byte *pbVar9;
  char *pcVar10;
  char *pcVar11;
  uint cp;
  uint local_4c;
  byte *local_48;
  uint local_3c;
  ulong local_38;
  
  pcVar6 = *string;
  pcVar10 = pcVar6;
  if (*pcVar6 == '\"') {
    do {
      while( true ) {
        pcVar11 = pcVar10;
        *string = pcVar11 + 1;
        cVar1 = pcVar11[1];
        if (cVar1 != '\\') break;
        *string = pcVar11 + 2;
        pcVar10 = pcVar11 + 2;
        if (pcVar11[2] == '\0') {
          return (char *)0x0;
        }
      }
      if (cVar1 == '\0') {
        return (char *)0x0;
      }
      pcVar10 = pcVar11 + 1;
    } while (cVar1 != '\"');
    *string = pcVar11 + 2;
    lVar8 = (long)(pcVar11 + 2) - (long)pcVar6;
    __src = (byte *)(*parson_malloc)(lVar8 - 1);
    if (__src != (byte *)0x0) {
      bVar3 = pcVar6[1];
      pbVar9 = __src;
      if (lVar8 != 2 && bVar3 != 0) {
        pcVar10 = pcVar6 + 1;
        do {
          if (bVar3 != 0x5c) {
            pcVar11 = pcVar10;
            if (0x1f < bVar3) goto LAB_0017a2b8;
            goto switchD_0017a2ef_caseD_6f;
          }
          pcVar11 = pcVar10 + 1;
          bVar3 = pcVar10[1];
          if (bVar3 < 0x62) {
            if (((bVar3 == 0x22) || (bVar3 == 0x2f)) || (bVar3 == 0x5c)) goto LAB_0017a2b8;
            goto switchD_0017a2ef_caseD_6f;
          }
          switch(bVar3) {
          case 0x6e:
            bVar3 = 10;
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
            goto switchD_0017a2ef_caseD_6f;
          case 0x72:
            bVar3 = 0xd;
            break;
          case 0x74:
            bVar3 = 9;
            break;
          case 0x75:
            local_48 = __src;
            JVar4 = parse_utf16_hex(pcVar10 + 2,&local_4c);
            if (JVar4 == 0) {
              bVar3 = (byte)local_4c;
              if (local_4c < 0x80) {
                *pbVar9 = bVar3;
LAB_0017a3b7:
                lVar5 = 1;
              }
              else {
                if (local_4c < 0x800) {
                  *pbVar9 = (byte)(local_4c >> 6) | 0xc0;
                  pbVar9[1] = bVar3 & 0x3f | 0x80;
                  pbVar9 = pbVar9 + 1;
                  goto LAB_0017a3b7;
                }
                if (local_4c - 0xe000 < 0xfffff800) {
                  *pbVar9 = (byte)(local_4c >> 0xc) & 0xf | 0xe0;
                  pbVar9[1] = (byte)(local_4c >> 6) & 0x3f | 0x80;
                  pbVar9[2] = bVar3 & 0x3f | 0x80;
                  pbVar9 = pbVar9 + 2;
                  goto LAB_0017a3b7;
                }
                if (((0xdbff < local_4c) || (pcVar10[6] != '\\')) || (pcVar10[7] != 'u')) {
                  bVar2 = false;
                  goto LAB_0017a3c5;
                }
                local_38 = (ulong)local_4c;
                JVar4 = parse_utf16_hex(pcVar10 + 8,&local_3c);
                if (local_3c - 0xe000 < 0xfffffc00 || JVar4 != 0) goto LAB_0017a319;
                uVar7 = ((uint)local_38 & 0x3ff) * 0x400;
                local_4c = (local_3c & 0x3ff) + uVar7 + 0x10000;
                *pbVar9 = (byte)(local_4c >> 0x12) | 0xf0;
                pbVar9[1] = (byte)(local_4c >> 0xc) & 0x3f | 0x80;
                pbVar9[2] = (byte)((local_3c & 0x3ff | uVar7) >> 6) & 0x3f | 0x80;
                pbVar9[3] = (byte)local_3c & 0x3f | 0x80;
                pbVar9 = pbVar9 + 3;
                lVar5 = 7;
              }
              pcVar11 = pcVar11 + lVar5 + 3;
              bVar2 = true;
            }
            else {
LAB_0017a319:
              bVar2 = false;
            }
LAB_0017a3c5:
            __src = local_48;
            if (bVar2) goto LAB_0017a2bb;
            goto switchD_0017a2ef_caseD_6f;
          default:
            if (bVar3 == 0x66) {
              bVar3 = 0xc;
            }
            else {
              if (bVar3 != 0x62) goto switchD_0017a2ef_caseD_6f;
              bVar3 = 8;
            }
          }
LAB_0017a2b8:
          *pbVar9 = bVar3;
LAB_0017a2bb:
          pbVar9 = pbVar9 + 1;
          bVar3 = pcVar11[1];
        } while ((bVar3 != 0) &&
                (pcVar10 = pcVar11 + 1, (ulong)((long)pcVar10 - (long)(pcVar6 + 1)) < lVar8 - 2U));
      }
      *pbVar9 = 0;
      __n = ((long)pbVar9 - (long)__src) + 1;
      pcVar6 = (char *)(*parson_malloc)(__n);
      if (pcVar6 != (char *)0x0) {
        memcpy(pcVar6,__src,__n);
        *output_string_len = (long)pbVar9 - (long)__src;
        (*parson_free)(__src);
        return pcVar6;
      }
    }
switchD_0017a2ef_caseD_6f:
    (*parson_free)(__src);
  }
  return (char *)0x0;
}

Assistant:

static char * get_quoted_string(const char **string, size_t *output_string_len) {
    const char *string_start = *string;
    size_t input_string_len = 0;
    JSON_Status status = skip_quotes(string);
    if (status != JSONSuccess) {
        return NULL;
    }
    input_string_len = *string - string_start - 2; /* length without quotes */
    return process_string(string_start + 1, input_string_len, output_string_len);
}